

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_comp_init(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  (G->data).root = pPVar1;
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_comp_init(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define e G->val[-1]
  yyprintf((stderr, "do yy_2_comp_init"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = (G->data.root = PVIP_node_new_children(&(G->data), PVIP_NODE_NOP)); }\n"));
  yy = (G->data.root = PVIP_node_new_children(&(G->data), PVIP_NODE_NOP)); ;
#undef e
}